

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instr.cpp
# Opt level: O1

ScalarFunction * duckdb::InstrFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  FunctionNullHandling in_stack_ffffffffffffff38;
  bind_lambda_function_t in_stack_ffffffffffffff40;
  scalar_function_t local_b8;
  LogicalType local_90;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  LogicalType local_60;
  LogicalType local_48 [2];
  
  LogicalType::LogicalType(local_48,VARCHAR);
  LogicalType::LogicalType(local_48 + 1,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_48;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_78,__l,(allocator_type *)&stack0xffffffffffffff47);
  LogicalType::LogicalType(&local_90,BIGINT);
  local_b8.super__Function_base._M_functor._8_8_ = 0;
  local_b8.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::BinaryFunction<duckdb::string_t,duckdb::string_t,long,duckdb::InstrOperator>;
  local_b8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_b8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_60,INVALID);
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_78,&local_90,&local_b8,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,InStrPropagateStats,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_60),CONSISTENT,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  LogicalType::~LogicalType(&local_60);
  if (local_b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b8.super__Function_base._M_manager)
              ((_Any_data *)&local_b8,(_Any_data *)&local_b8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_90);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_48[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return in_RDI;
}

Assistant:

ScalarFunction InstrFun::GetFunction() {
	return ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::BIGINT,
	                      ScalarFunction::BinaryFunction<string_t, string_t, int64_t, InstrOperator>, nullptr, nullptr,
	                      InStrPropagateStats);
}